

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O0

CURLcode Curl_pp_vsendf(pingpong *pp,char *fmt,__va_list_tag *args)

{
  connectdata *conn_00;
  CURLcode CVar1;
  char *pcVar2;
  char *__s;
  size_t len;
  timeval tVar3;
  __time_t local_70;
  __suseconds_t local_68;
  SessionHandle *data;
  connectdata *conn;
  CURLcode error;
  char *s;
  char *fmt_crlf;
  size_t write_len;
  ssize_t bytes_written;
  __va_list_tag *args_local;
  char *fmt_local;
  pingpong *pp_local;
  
  conn_00 = pp->conn;
  bytes_written = (ssize_t)args;
  args_local = (__va_list_tag *)fmt;
  fmt_local = (char *)pp;
  pcVar2 = curl_maprintf("%s\r\n",fmt);
  if (pcVar2 == (char *)0x0) {
    pp_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    __s = curl_mvaprintf(pcVar2,(__va_list_tag *)bytes_written);
    (*Curl_cfree)(pcVar2);
    if (__s == (char *)0x0) {
      pp_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      write_len = 0;
      len = strlen(__s);
      Curl_pp_init((pingpong *)fmt_local);
      CVar1 = Curl_write(conn_00,conn_00->sock[0],__s,len,(ssize_t *)&write_len);
      if (CVar1 == CURLE_OK) {
        if (((conn_00->data->set).verbose & 1U) != 0) {
          Curl_debug(conn_00->data,CURLINFO_HEADER_OUT,__s,write_len,conn_00);
        }
        if (write_len == len) {
          (*Curl_cfree)(__s);
          pcVar2 = fmt_local;
          fmt_local[0x28] = '\0';
          fmt_local[0x29] = '\0';
          fmt_local[0x2a] = '\0';
          fmt_local[0x2b] = '\0';
          fmt_local[0x2c] = '\0';
          fmt_local[0x2d] = '\0';
          fmt_local[0x2e] = '\0';
          fmt_local[0x2f] = '\0';
          fmt_local[0x38] = '\0';
          fmt_local[0x39] = '\0';
          fmt_local[0x3a] = '\0';
          fmt_local[0x3b] = '\0';
          fmt_local[0x3c] = '\0';
          fmt_local[0x3d] = '\0';
          fmt_local[0x3e] = '\0';
          fmt_local[0x3f] = '\0';
          fmt_local[0x30] = '\0';
          fmt_local[0x31] = '\0';
          fmt_local[0x32] = '\0';
          fmt_local[0x33] = '\0';
          fmt_local[0x34] = '\0';
          fmt_local[0x35] = '\0';
          fmt_local[0x36] = '\0';
          fmt_local[0x37] = '\0';
          tVar3 = curlx_tvnow();
          local_70 = tVar3.tv_sec;
          *(__time_t *)(pcVar2 + 0x40) = local_70;
          local_68 = tVar3.tv_usec;
          *(__suseconds_t *)(pcVar2 + 0x48) = local_68;
        }
        else {
          *(char **)(fmt_local + 0x28) = __s;
          *(size_t *)(fmt_local + 0x38) = len;
          *(size_t *)(fmt_local + 0x30) = len - write_len;
        }
        pp_local._4_4_ = CURLE_OK;
      }
      else {
        (*Curl_cfree)(__s);
        pp_local._4_4_ = CVar1;
      }
    }
  }
  return pp_local._4_4_;
}

Assistant:

CURLcode Curl_pp_vsendf(struct pingpong *pp,
                        const char *fmt,
                        va_list args)
{
  ssize_t bytes_written;
  size_t write_len;
  char *fmt_crlf;
  char *s;
  CURLcode error;
  struct connectdata *conn = pp->conn;
  struct SessionHandle *data = conn->data;

#ifdef HAVE_GSSAPI
  enum protection_level data_sec = conn->data_prot;
#endif

  DEBUGASSERT(pp->sendleft == 0);
  DEBUGASSERT(pp->sendsize == 0);
  DEBUGASSERT(pp->sendthis == NULL);

  fmt_crlf = aprintf("%s\r\n", fmt); /* append a trailing CRLF */
  if(!fmt_crlf)
    return CURLE_OUT_OF_MEMORY;

  s = vaprintf(fmt_crlf, args); /* trailing CRLF appended */
  free(fmt_crlf);
  if(!s)
    return CURLE_OUT_OF_MEMORY;

  bytes_written = 0;
  write_len = strlen(s);

  Curl_pp_init(pp);

  error = Curl_convert_to_network(data, s, write_len);
  /* Curl_convert_to_network calls failf if unsuccessful */
  if(error) {
    free(s);
    return error;
  }

#ifdef HAVE_GSSAPI
  conn->data_prot = PROT_CMD;
#endif
  error = Curl_write(conn, conn->sock[FIRSTSOCKET], s, write_len,
                     &bytes_written);
#ifdef HAVE_GSSAPI
  DEBUGASSERT(data_sec > PROT_NONE && data_sec < PROT_LAST);
  conn->data_prot = data_sec;
#endif

  if(error) {
    free(s);
    return error;
  }

  if(conn->data->set.verbose)
    Curl_debug(conn->data, CURLINFO_HEADER_OUT,
               s, (size_t)bytes_written, conn);

  if(bytes_written != (ssize_t)write_len) {
    /* the whole chunk was not sent, keep it around and adjust sizes */
    pp->sendthis = s;
    pp->sendsize = write_len;
    pp->sendleft = write_len - bytes_written;
  }
  else {
    free(s);
    pp->sendthis = NULL;
    pp->sendleft = pp->sendsize = 0;
    pp->response = Curl_tvnow();
  }

  return CURLE_OK;
}